

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall
leveldb::CorruptionTest::Corrupt
          (CorruptionTest *this,FileType filetype,int offset,int bytes_to_corrupt)

{
  Env *pEVar1;
  Status SVar2;
  CorruptionTest *pCVar3;
  bool bVar4;
  int iVar5;
  Tester *pTVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  size_t i;
  ulong uVar10;
  Status s;
  FileType filetype_local;
  int local_278;
  FileType type;
  string contents;
  string fname;
  uint64_t number;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string local_210;
  ulong local_1f0;
  CorruptionTest *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  uint64_t file_size;
  pointer local_1d0;
  char *pcStack_1c8;
  
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filetype_local = filetype;
  local_278 = offset;
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x73);
  pEVar1 = (this->env_).super_EnvWrapper.target_;
  local_1e0 = &this->dbname_;
  (*pEVar1->_vptr_Env[7])(&fname,pEVar1,local_1e0,&filenames);
  local_1f0 = (ulong)(uint)bytes_to_corrupt;
  local_1e8 = this;
  test::Tester::IsOk((Tester *)&local_1d0,(Status *)&fname);
  Status::~Status((Status *)&fname);
  test::Tester::~Tester((Tester *)&local_1d0);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar9 = -1;
  lVar7 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)filenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)filenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar10 = uVar10 + 1) {
    bVar4 = ParseFileName((string *)
                          ((long)&((filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar7),&number,&type);
    if (((bVar4) && (type == filetype_local)) && (iVar9 < (int)number)) {
      std::operator+(&contents,local_1e0,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,&contents,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((filenames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7
                     ));
      std::__cxx11::string::operator=((string *)&fname,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&contents);
      iVar9 = (int)number;
    }
    lVar7 = lVar7 + 0x20;
  }
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x7f);
  pTVar6 = test::Tester::Is((Tester *)&local_1d0,fname._M_string_length != 0,"!fname.empty()");
  pCVar3 = local_1e8;
  test::Tester::operator<<(pTVar6,&filetype_local);
  test::Tester::~Tester((Tester *)&local_1d0);
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x82);
  pEVar1 = (pCVar3->env_).super_EnvWrapper.target_;
  (*pEVar1->_vptr_Env[0xb])(&contents,pEVar1,&fname);
  test::Tester::IsOk((Tester *)&local_1d0,(Status *)&contents);
  Status::~Status((Status *)&contents);
  test::Tester::~Tester((Tester *)&local_1d0);
  iVar5 = (int)file_size;
  iVar9 = local_278;
  if ((local_278 < 0) && (iVar9 = 0, (uint)-local_278 <= file_size)) {
    iVar9 = local_278 + iVar5;
  }
  if (file_size < (ulong)(long)iVar9) {
    iVar9 = iVar5;
  }
  uVar8 = iVar5 - iVar9;
  if ((ulong)(long)(int)(iVar9 + (uint)local_1f0) <= file_size) {
    uVar8 = (uint)local_1f0;
  }
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  contents._M_string_length = 0;
  contents.field_2._M_local_buf[0] = '\0';
  ReadFileToString((leveldb *)&s,(pCVar3->env_).super_EnvWrapper.target_,&fname,&contents);
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x96);
  pTVar6 = test::Tester::Is((Tester *)&local_1d0,s.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_210,&s);
  test::Tester::operator<<(pTVar6,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)&local_1d0);
  lVar7 = (long)iVar9;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  while (bVar4 = uVar10 != 0, uVar10 = uVar10 - 1, bVar4) {
    contents._M_dataplus._M_p[lVar7] = contents._M_dataplus._M_p[lVar7] ^ 0x80;
    lVar7 = lVar7 + 1;
  }
  local_1d0 = contents._M_dataplus._M_p;
  pcStack_1c8 = (char *)contents._M_string_length;
  WriteStringToFile((leveldb *)&local_210,(pCVar3->env_).super_EnvWrapper.target_,
                    (Slice *)&local_1d0,&fname);
  SVar2 = s;
  s.state_ = local_210._M_dataplus._M_p;
  local_210._M_dataplus._M_p = SVar2.state_;
  Status::~Status((Status *)&local_210);
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x9b);
  pTVar6 = test::Tester::Is((Tester *)&local_1d0,s.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_210,&s);
  test::Tester::operator<<(pTVar6,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)&local_1d0);
  Status::~Status(&s);
  std::__cxx11::string::~string((string *)&contents);
  std::__cxx11::string::~string((string *)&fname);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  return;
}

Assistant:

void Corrupt(FileType filetype, int offset, int bytes_to_corrupt) {
    // Pick file to corrupt
    std::vector<std::string> filenames;
    ASSERT_OK(env_.target()->GetChildren(dbname_, &filenames));
    uint64_t number;
    FileType type;
    std::string fname;
    int picked_number = -1;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) && type == filetype &&
          int(number) > picked_number) {  // Pick latest file
        fname = dbname_ + "/" + filenames[i];
        picked_number = number;
      }
    }
    ASSERT_TRUE(!fname.empty()) << filetype;

    uint64_t file_size;
    ASSERT_OK(env_.target()->GetFileSize(fname, &file_size));

    if (offset < 0) {
      // Relative to end of file; make it absolute
      if (-offset > file_size) {
        offset = 0;
      } else {
        offset = file_size + offset;
      }
    }
    if (offset > file_size) {
      offset = file_size;
    }
    if (offset + bytes_to_corrupt > file_size) {
      bytes_to_corrupt = file_size - offset;
    }

    // Do it
    std::string contents;
    Status s = ReadFileToString(env_.target(), fname, &contents);
    ASSERT_TRUE(s.ok()) << s.ToString();
    for (int i = 0; i < bytes_to_corrupt; i++) {
      contents[i + offset] ^= 0x80;
    }
    s = WriteStringToFile(env_.target(), contents, fname);
    ASSERT_TRUE(s.ok()) << s.ToString();
  }